

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

bool __thiscall
UdpSocketImpl::AddToMulticastGroup
          (UdpSocketImpl *this,char *szMulticastIp,char *szInterfaceIp,uint32_t nInterfaceIndex)

{
  int iVar1;
  int *piVar2;
  uint32_t *__buf;
  int __optname;
  int __level;
  uint32_t loop;
  uint32_t hops;
  addrinfo *lstAddr;
  ipv6_mreq mreq;
  undefined4 local_58;
  undefined4 local_54;
  addrinfo *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_38 [4];
  
  iVar1 = getaddrinfo(szMulticastIp,(char *)0x0,(addrinfo *)0x0,&local_50);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = local_50->ai_family;
  freeaddrinfo(local_50);
  local_54 = 0xff;
  local_58 = 1;
  if (iVar1 == 10) {
    local_48 = 0;
    uStack_40 = 0;
    local_38[0] = 0;
    inet_pton(10,szMulticastIp,&local_48);
    local_38[0] = nInterfaceIndex;
    iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x14,&local_48,0x14);
    if (((iVar1 != 0) ||
        (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x12,&local_54,4), iVar1 != 0)
        ) || (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x13,&local_58,4),
             iVar1 != 0)) goto LAB_0011cf5d;
    __buf = local_38;
    iVar1 = (this->super_BaseSocketImpl).m_fSock;
    __level = 0x29;
    __optname = 0x11;
  }
  else {
    local_48 = 0;
    inet_pton(2,szMulticastIp,&local_48);
    __buf = (uint32_t *)((long)&local_48 + 4);
    inet_pton(2,szInterfaceIp,__buf);
    iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x23,&local_48,8);
    if (((iVar1 != 0) ||
        (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x21,&local_54,4), iVar1 != 0))
       || (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x22,&local_58,4), iVar1 != 0))
    goto LAB_0011cf5d;
    iVar1 = (this->super_BaseSocketImpl).m_fSock;
    __level = 0;
    __optname = 0x20;
  }
  iVar1 = setsockopt(iVar1,__level,__optname,__buf,4);
  if (iVar1 == 0) {
    return true;
  }
LAB_0011cf5d:
  piVar2 = __errno_location();
  (this->super_BaseSocketImpl).m_iError = *piVar2;
  (this->super_BaseSocketImpl).m_iErrLoc = 2;
  return false;
}

Assistant:

bool UdpSocketImpl::AddToMulticastGroup(const char* const szMulticastIp, const char* const szInterfaceIp, uint32_t nInterfaceIndex) noexcept
#endif
{
    struct addrinfo *lstAddr;
    if (::getaddrinfo(szMulticastIp, nullptr, nullptr, &lstAddr) != 0)
        return false;
    const int iAddFamily = lstAddr->ai_family;
    ::freeaddrinfo(lstAddr);

    constexpr uint32_t hops = static_cast<uint8_t>('\xff');
    constexpr uint32_t loop = 1;

    if (iAddFamily == AF_INET6)
    {
        ipv6_mreq mreq{IN6ADDR_ANY_INIT, 0};
        inet_pton(AF_INET6, szMulticastIp, &mreq.ipv6mr_multiaddr);
        mreq.ipv6mr_interface = nInterfaceIndex;

        // http://www.tldp.org/HOWTO/Multicast-HOWTO-6.html
        if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_ADD_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, reinterpret_cast<const char*>(&hops), sizeof(hops)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, reinterpret_cast<const char*>(&loop), sizeof(loop)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_IF, reinterpret_cast<char*>(&mreq.ipv6mr_interface), sizeof(mreq.ipv6mr_interface)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 2;
            return false;
        }
    }
    else
    {
        ip_mreq mreq{{0},{0}};
        inet_pton(AF_INET, szMulticastIp, &mreq.imr_multiaddr.s_addr);
#if defined(_WIN32) || defined(_WIN64)
        mreq.imr_interface.s_addr = htonl(nInterfaceIndex);
#else
        inet_pton(AF_INET, szInterfaceIp, &mreq.imr_interface.s_addr);
#endif

        if (::setsockopt(m_fSock, IPPROTO_IP, IP_ADD_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_TTL, reinterpret_cast<const char*>(&hops), sizeof(hops)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_LOOP, reinterpret_cast<const char*>(&loop), sizeof(loop)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_IF, reinterpret_cast<char*>(&mreq.imr_interface), sizeof(mreq.imr_interface)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 2;
            return false;
        }
    }

    return true;
}